

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_2_5::Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(IStream *in,int n)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char c [1024];
  undefined1 auStack_418 [1024];
  
  uVar3 = (ulong)(uint)n;
  while( true ) {
    iVar2 = (int)uVar3;
    if (iVar2 < 0x400) {
      if (0 < iVar2) {
        (*in->_vptr_IStream[3])(in,auStack_418,uVar3);
      }
      return;
    }
    iVar1 = (*in->_vptr_IStream[3])(in,auStack_418,0x400);
    if ((char)iVar1 == '\0') break;
    uVar3 = (ulong)(iVar2 - 0x400);
  }
  return;
}

Assistant:

void
skip (T &in, int n)			// skip n padding bytes
{
    char c[1024];

    while (n >= (int) sizeof (c))
    {
	if (!S::readChars (in, c, sizeof (c)))
	    return;

	n -= sizeof (c);
    }

    if (n >= 1)
	S::readChars (in, c, n);
}